

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

int ellswift_xdh_hash_function_bip324
              (uchar *output,uchar *x32,uchar *ell_a64,uchar *ell_b64,void *data)

{
  secp256k1_sha256 local_98;
  
  local_98.s[0] = 0x8c12d730;
  local_98.s[1] = 0x827bd392;
  local_98.s[2] = 0x9e4fb2ee;
  local_98.s[3] = 0x207b373e;
  local_98.s[4] = 0x2292bd7a;
  local_98.s[5] = 0xaa5441bc;
  local_98.s[6] = 0x15c3779f;
  local_98.s[7] = 0xcfb52549;
  local_98.bytes = 0x40;
  secp256k1_sha256_write(&local_98,ell_a64,0x40);
  secp256k1_sha256_write(&local_98,ell_b64,0x40);
  secp256k1_sha256_write(&local_98,x32,0x20);
  secp256k1_sha256_finalize(&local_98,output);
  return 1;
}

Assistant:

static int ellswift_xdh_hash_function_bip324(unsigned char* output, const unsigned char *x32, const unsigned char *ell_a64, const unsigned char *ell_b64, void *data) {
    secp256k1_sha256 sha;

    (void)data;

    secp256k1_ellswift_sha256_init_bip324(&sha);
    secp256k1_sha256_write(&sha, ell_a64, 64);
    secp256k1_sha256_write(&sha, ell_b64, 64);
    secp256k1_sha256_write(&sha, x32, 32);
    secp256k1_sha256_finalize(&sha, output);
    secp256k1_sha256_clear(&sha);

    return 1;
}